

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O2

bool __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::
normalize_rec(miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *this,
             spectrum *lspec,uint v)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  spectral_operation sVar6;
  pair<int,_int> pVar7;
  mapped_type *pmVar8;
  int iVar9;
  ulong uVar10;
  uint i;
  ulong uVar11;
  ulong local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  spectrum *local_40;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  uVar4 = this->step_counter + 1;
  this->step_counter = uVar4;
  if (uVar4 == this->step_limit) {
    return false;
  }
  if (this->num_vars_exp == v) {
    if ((this->hasOutputNegation == true) &&
       (*(lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start < 0)) {
      sVar6 = spectrum::output_negation(lspec);
      local_68 = CONCAT26(local_68._6_2_,sVar6);
      insert(this,(spectral_operation *)&local_68);
    }
    if (this->hasInputNegation == true) {
      for (uVar4 = 1; uVar4 < this->num_vars_exp; uVar4 = uVar4 * 2) {
        if ((lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4] < 0) {
          sVar6 = spectrum::input_negation(lspec,uVar4);
          local_68 = CONCAT26(local_68._6_2_,sVar6);
          insert(this,(spectral_operation *)&local_68);
        }
      }
    }
    closer(this,(UI *)lspec);
  }
  else {
    pVar7 = std::
            accumulate<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::pair<int,int>,kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>>::normalize_rec(kitty::detail::spectrum&,unsigned_int)::_lambda(auto:1,auto:2)_1_>
                      ((lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + v,
                       (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    uVar10 = (ulong)pVar7 >> 0x20;
    if (uVar10 == 0) {
      local_68 = (ulong)this->num_vars_exp;
      pmVar8 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this->specs,&local_68);
      spectrum::operator=(pmVar8,lspec);
      bVar3 = normalize_rec(this,pmVar8,this->num_vars_exp);
      if (!bVar3) {
        return false;
      }
    }
    else {
      local_60 = -v;
      local_38 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->specs;
      local_50 = (ulong)(v * 2);
      local_58 = (ulong)v;
      local_48 = uVar10;
      local_40 = lspec;
      for (uVar11 = 1;
          piVar2 = (lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
          uVar11 < (ulong)((long)(lspec->_s).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar2 >> 2);
          uVar11 = (ulong)((int)uVar11 + 1)) {
        uVar4 = (this->order).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar11];
        iVar1 = piVar2[uVar4];
        iVar9 = -iVar1;
        if (0 < iVar1) {
          iVar9 = iVar1;
        }
        if ((iVar9 == (int)uVar10) && (uVar5 = uVar4 & local_60, uVar5 != 0)) {
          uVar5 = -uVar5 & uVar5;
          local_68 = local_50;
          pmVar8 = std::__detail::
                   _Map_base<unsigned_long,_std::pair<const_unsigned_long,_kitty::detail::spectrum>,_std::allocator<std::pair<const_unsigned_long,_kitty::detail::spectrum>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::at(local_38,&local_68);
          spectrum::operator=(pmVar8,lspec);
          local_5c = this->transform_index;
          for (uVar4 = uVar4 ^ uVar5; uVar4 != 0; uVar4 = uVar4 ^ -uVar4 & uVar4) {
            sVar6 = spectrum::spectral_translation(pmVar8,uVar5,-uVar4 & uVar4);
            local_68 = CONCAT26(local_68._6_2_,sVar6);
            insert(this,(spectral_operation *)&local_68);
          }
          if (uVar5 != (uint)local_58) {
            sVar6 = spectrum::permutation(pmVar8,uVar5,(uint)local_58);
            local_68 = CONCAT26(local_68._6_2_,sVar6);
            insert(this,(spectral_operation *)&local_68);
          }
          bVar3 = normalize_rec(this,pmVar8,(uint)local_50);
          if (!bVar3 || pVar7.first == pVar7.second && v == 1) {
            return bVar3;
          }
          this->transform_index = local_5c;
          uVar10 = local_48;
          lspec = local_40;
        }
      }
    }
  }
  return true;
}

Assistant:

bool normalize_rec( spectrum& lspec, unsigned v )
  {
    if ( ++step_counter == step_limit )
      return false;

    if ( v == num_vars_exp ) /* leaf case */
    {
      /* invert function if necessary */
      if ( hasOutputNegation && lspec[0u] < 0 )
      {
        insert( lspec.output_negation() );
      }
      /* invert any variable as necessary */
      if ( hasInputNegation )
      {
        for ( auto i = 1u; i < num_vars_exp; i <<= 1 )
        {
          if ( lspec[i] < 0 )
          {
            insert( lspec.input_negation( i ) );
          }
        }
      }

      closer( lspec );
      return true;
    }

    auto min = 0, max = 0;
    const auto p = std::accumulate( lspec.cbegin() + v, lspec.cend(),
                                    std::make_pair( min, max ),
                                    []( auto a, auto sv )
                                    {
                                      return std::make_pair( std::min( a.first, abs( sv ) ), std::max( a.second, abs( sv ) ) );
                                    } );
    min = p.first;
    max = p.second;

    if ( max == 0 )
    {
      auto& spec2 = specs.at( num_vars_exp );
      spec2 = lspec;
      if ( !normalize_rec( spec2, num_vars_exp ) )
        return false;
    }
    else
    {
      for ( auto i = 1u; i < lspec.size(); ++i )
      {
        auto j = order[i];
        if ( abs( lspec[j] ) != max )
        {
          continue;
        }

        /* k = first one bit in j starting from pos v */
        auto k = j & ~( v - 1 ); /* remove 1 bits until v */
        if ( k == 0 )
        {
          continue; /* are there bit left? */
        }
        k = k - ( k & ( k - 1 ) ); /* extract lowest bit */
        j ^= k;                    /* remove bit k from j */

        auto& spec2 = specs.at( v << 1 );
        spec2 = lspec;

        const auto save = transform_index;

        /* spectral translation to all other 1s in j */
        while ( j )
        {
          auto p = j - ( j & ( j - 1 ) );
          insert( spec2.spectral_translation( k, p ) );
          j ^= p;
        }

        if ( k != v )
        {
          insert( spec2.permutation( k, v ) );
        }

        if ( !normalize_rec( spec2, v << 1 ) )
          return false;

        if ( v == 1 && min == max )
        {
          return true;
        }
        transform_index = save;
      }
    }

    return true;
  }